

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int toLocaltime(DateTime *p,sqlite3_context *pCtx)

{
  int iVar1;
  undefined1 local_98 [8];
  DateTime x;
  undefined1 local_60 [4];
  int iYearDiff;
  tm sLocal;
  time_t t;
  sqlite3_context *pCtx_local;
  DateTime *p_local;
  
  memset(local_60,0,0x38);
  computeJD(p);
  if ((p->iJD < 0xbfc83e532200) || (0xc1bc387b0a00 < p->iJD)) {
    memcpy(local_98,p,0x30);
    computeYMD_HMS((DateTime *)local_98);
    x._44_4_ = ((int)x.iJD % 4 + 2000) - (int)x.iJD;
    x.iJD._0_4_ = x._44_4_ + (int)x.iJD;
    x.s._0_1_ = 0;
    computeJD((DateTime *)local_98);
  }
  else {
    x.validTZ = '\0';
    x.tzSet = '\0';
    x.isError = '\0';
    x._47_1_ = 0;
    local_98 = (undefined1  [8])p->iJD;
  }
  sLocal.tm_zone = (char *)((long)local_98 / 1000 + -0x3118a36940);
  iVar1 = osLocaltime((time_t *)&sLocal.tm_zone,(tm *)local_60);
  if (iVar1 == 0) {
    p->Y = (sLocal.tm_mday + 0x76c) - x._44_4_;
    p->M = sLocal.tm_hour + 1;
    p->D = sLocal.tm_min;
    p->h = sLocal.tm_sec;
    p->m = iYearDiff;
    p->s = (double)(p->iJD % 1000) * 0.001 + (double)(int)local_60;
    p->validYMD = '\x01';
    p->validHMS = '\x01';
    p->validJD = '\0';
    p->rawS = '\0';
    p->validTZ = '\0';
    p->isError = '\0';
  }
  else {
    sqlite3_result_error(pCtx,"local time unavailable",-1);
  }
  p_local._4_4_ = (uint)(iVar1 != 0);
  return p_local._4_4_;
}

Assistant:

static int toLocaltime(
  DateTime *p,                   /* Date at which to calculate offset */
  sqlite3_context *pCtx          /* Write error here if one occurs */
){
  time_t t;
  struct tm sLocal;
  int iYearDiff;

  /* Initialize the contents of sLocal to avoid a compiler warning. */
  memset(&sLocal, 0, sizeof(sLocal));

  computeJD(p);
  if( p->iJD<2108667600*(i64)100000 /* 1970-01-01 */
   || p->iJD>2130141456*(i64)100000 /* 2038-01-18 */
  ){
    /* EVIDENCE-OF: R-55269-29598 The localtime_r() C function normally only
    ** works for years between 1970 and 2037. For dates outside this range,
    ** SQLite attempts to map the year into an equivalent year within this
    ** range, do the calculation, then map the year back.
    */
    DateTime x = *p;
    computeYMD_HMS(&x);
    iYearDiff = (2000 + x.Y%4) - x.Y;
    x.Y += iYearDiff;
    x.validJD = 0;
    computeJD(&x);
    t = (time_t)(x.iJD/1000 -  21086676*(i64)10000);
  }else{
    iYearDiff = 0;
    t = (time_t)(p->iJD/1000 -  21086676*(i64)10000);
  }
  if( osLocaltime(&t, &sLocal) ){
    sqlite3_result_error(pCtx, "local time unavailable", -1);
    return SQLITE_ERROR;
  }
  p->Y = sLocal.tm_year + 1900 - iYearDiff;
  p->M = sLocal.tm_mon + 1;
  p->D = sLocal.tm_mday;
  p->h = sLocal.tm_hour;
  p->m = sLocal.tm_min;
  p->s = sLocal.tm_sec + (p->iJD%1000)*0.001;
  p->validYMD = 1;
  p->validHMS = 1;
  p->validJD = 0;
  p->rawS = 0;
  p->validTZ = 0;
  p->isError = 0;
  return SQLITE_OK;
}